

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::DvpVerifyStateTransitionDesc
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,StateTransitionDesc *Barrier)

{
  bool bVar1;
  RenderDeviceVkImpl *pDevice;
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  StateTransitionDesc *Barrier_local;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  pDevice = Diligent::RefCntAutoPtr::operator_cast_to_RenderDeviceVkImpl_
                      ((RefCntAutoPtr *)&this->m_pDevice);
  msg.field_2._M_local_buf[0xf] = (char)GetExecutionCtxId(this);
  bVar1 = VerifyStateTransitionDesc
                    ((IRenderDevice *)pDevice,Barrier,
                     (DeviceContextIndex)msg.field_2._M_local_buf[0xf],&this->m_Desc);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    FormatString<char[32]>((string *)local_40,(char (*) [32])"StateTransitionDesc are invalid");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"DvpVerifyStateTransitionDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0xa42);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::DvpVerifyStateTransitionDesc(const StateTransitionDesc& Barrier) const
{
    DEV_CHECK_ERR(VerifyStateTransitionDesc(m_pDevice, Barrier, GetExecutionCtxId(), this->m_Desc), "StateTransitionDesc are invalid");
}